

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O2

void __thiscall
Js::DynamicProfileInfo::RecordParameterAtCallSite
          (DynamicProfileInfo *this,FunctionBody *functionBody,ProfileId callSiteId,Var arg,
          int argNum,RegSlot regSlot)

{
  undefined1 *puVar1;
  byte bVar2;
  code *pcVar3;
  bool bVar4;
  RegSlot RVar5;
  undefined4 *puVar6;
  CallbackInfo *pCVar7;
  JavascriptFunction *pJVar8;
  FunctionBody *this_00;
  Type local_40;
  Type local_3c;
  SourceId sourceId;
  LocalFunctionId functionId;
  
  sourceId = regSlot;
  functionId = argNum;
  if ((this->persistsAcrossScriptContexts == false) && ((this->functionBody).ptr != functionBody)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x1ac,
                                "(!DynamicProfileInfo::NeedProfileInfoList() || this->persistsAcrossScriptContexts || this->functionBody == functionBody)"
                                ,
                                "!DynamicProfileInfo::NeedProfileInfoList() || this->persistsAcrossScriptContexts || this->functionBody == functionBody"
                               );
    if (!bVar4) goto LAB_00885c00;
    *puVar6 = 0;
  }
  if (0xe < functionId) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x1af,"(argNum < Js::InlineeCallInfo::MaxInlineeArgoutCount)",
                                "argNum < Js::InlineeCallInfo::MaxInlineeArgoutCount");
    if (!bVar4) goto LAB_00885c00;
    *puVar6 = 0;
  }
  if (functionBody->profiledCallSiteCount <= callSiteId) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x1b0,"(callSiteId < functionBody->GetProfiledCallSiteCount())",
                                "callSiteId < functionBody->GetProfiledCallSiteCount()");
    if (!bVar4) {
LAB_00885c00:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  this_00 = functionBody;
  bVar4 = PhaseIsEnabled::InlineCallbacksPhase<Js::FunctionBody*>(functionBody);
  if (bVar4) {
    if (((ulong)arg >> 0x30 == 0 && arg != (Var)0x0) &&
       (this_00 = (FunctionBody *)arg, bVar4 = VarIs<Js::JavascriptFunction>(arg), bVar4)) {
      pCVar7 = EnsureCallbackInfo((DynamicProfileInfo *)this_00,functionBody,callSiteId);
      if (pCVar7->sourceId == 0xffffffff) {
        pJVar8 = UnsafeVarTo<Js::JavascriptFunction>(arg);
        GetSourceAndFunctionId
                  (functionBody,(pJVar8->functionInfo).ptr,pJVar8,&pCVar7->sourceId,
                   &pCVar7->functionId);
        *(byte *)pCVar7 = *(byte *)pCVar7 & 0x83 | ((byte)functionId & 0x1f) << 2;
        return;
      }
      bVar2 = *(byte *)pCVar7;
      if ((bVar2 & 1) == 0) {
        return;
      }
      if ((bVar2 >> 2 & 0x1f) != functionId) {
        *(byte *)pCVar7 = bVar2 & 0xfe;
        return;
      }
      if ((bVar2 & 2) != 0) {
        return;
      }
      pJVar8 = UnsafeVarTo<Js::JavascriptFunction>(arg);
      GetSourceAndFunctionId(functionBody,(pJVar8->functionInfo).ptr,pJVar8,&local_40,&local_3c);
      if ((local_40 == pCVar7->sourceId) && (local_3c == pCVar7->functionId)) {
        return;
      }
      *(byte *)pCVar7 = *(byte *)pCVar7 | 2;
      return;
    }
    pCVar7 = FindCallbackInfo((DynamicProfileInfo *)this_00,functionBody,callSiteId);
    if ((pCVar7 != (CallbackInfo *)0x0) && ((*(uint *)pCVar7 >> 2 & 0x1f) == functionId)) {
      *(byte *)pCVar7 = (byte)*(uint *)pCVar7 & 0xfe;
    }
    bVar4 = TaggedInt::Is(arg);
    if ((bVar4) && (RVar5 = FunctionBody::GetConstantCount(functionBody), sourceId < RVar5)) {
      puVar1 = &(this->callSiteInfo).ptr[callSiteId].field_0x2;
      *(ushort *)puVar1 = *(ushort *)puVar1 | (ushort)(1 << ((byte)functionId & 0x1f)) & 0x1fff;
    }
  }
  else {
    bVar4 = TaggedInt::Is(arg);
    if ((bVar4) && (RVar5 = FunctionBody::GetConstantCount(functionBody), sourceId < RVar5)) {
      puVar1 = &(this->callSiteInfo).ptr[callSiteId].field_0x2;
      *(ushort *)puVar1 = *(ushort *)puVar1 | (ushort)(1 << ((byte)functionId & 0x1f)) & 0x1fff;
    }
  }
  return;
}

Assistant:

void DynamicProfileInfo::RecordParameterAtCallSite(FunctionBody * functionBody, ProfileId callSiteId, Var arg, int argNum, Js::RegSlot regSlot)
    {
#if DBG_DUMP || defined(DYNAMIC_PROFILE_STORAGE) || defined(RUNTIME_DATA_COLLECTION)
        // If we persistsAcrossScriptContext, the dynamic profile info may be referred to by multiple function body from
        // different script context
        Assert(!DynamicProfileInfo::NeedProfileInfoList() || this->persistsAcrossScriptContexts || this->functionBody == functionBody);
#endif

        Assert(argNum < Js::InlineeCallInfo::MaxInlineeArgoutCount);
        Assert(callSiteId < functionBody->GetProfiledCallSiteCount());

        if (!PHASE_ENABLED(InlineCallbacksPhase, functionBody))
        {
            if (TaggedInt::Is(arg) && regSlot < functionBody->GetConstantCount())
            {
                callSiteInfo[callSiteId].isArgConstant = callSiteInfo[callSiteId].isArgConstant | (1 << argNum);
            }
            return;
        }

        if (arg != nullptr && VarIs<RecyclableObject>(arg) && VarIs<JavascriptFunction>(arg))
        {
            CallbackInfo * callbackInfo = EnsureCallbackInfo(functionBody, callSiteId);
            if (callbackInfo->sourceId == NoSourceId)
            {
                JavascriptFunction * callback = UnsafeVarTo<JavascriptFunction>(arg);
                GetSourceAndFunctionId(functionBody, callback->GetFunctionInfo(), callback, &callbackInfo->sourceId, &callbackInfo->functionId);
                callbackInfo->argNumber = argNum;
            }
            else if (callbackInfo->canInlineCallback)
            {
                if (argNum != callbackInfo->argNumber)
                {
                    callbackInfo->canInlineCallback = false;
                }
                else if (!callbackInfo->isPolymorphic)
                {
                    Js::SourceId sourceId;
                    Js::LocalFunctionId functionId;
                    JavascriptFunction * callback = UnsafeVarTo<JavascriptFunction>(arg);
                    GetSourceAndFunctionId(functionBody, callback->GetFunctionInfo(), callback, &sourceId, &functionId);

                    if (sourceId != callbackInfo->sourceId || functionId != callbackInfo->functionId)
                    {
                        callbackInfo->isPolymorphic = true;
                    }
                }
            }
        }
        else
        {
            CallbackInfo * callbackInfo = FindCallbackInfo(functionBody, callSiteId);
            if (callbackInfo != nullptr && callbackInfo->argNumber == argNum)
            {
                callbackInfo->canInlineCallback = false;
            }

            if (TaggedInt::Is(arg) && regSlot < functionBody->GetConstantCount())
            {
                callSiteInfo[callSiteId].isArgConstant = callSiteInfo[callSiteId].isArgConstant | (1 << argNum);
            }
        }
    }